

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall
rcg::Stream::Stream(Stream *this,shared_ptr<rcg::Device> *_parent,
                   shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  char *in_RCX;
  long in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *psVar1;
  shared_ptr<const_rcg::GenTLWrapper> *this_00;
  Stream *in_stack_ffffffffffffffa0;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffa8;
  Buffer *in_stack_ffffffffffffffb0;
  
  std::enable_shared_from_this<rcg::Stream>::enable_shared_from_this
            ((enable_shared_from_this<rcg::Stream> *)0x14f357);
  Buffer::Buffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::shared_ptr<rcg::Device>::shared_ptr((shared_ptr<rcg::Device> *)0x14f387);
  std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x14f39a);
  std::__cxx11::string::string((string *)(in_RDI + 0x80));
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x14f3be);
  psVar1 = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 0xe8);
  std::shared_ptr<rcg::CPort>::shared_ptr((shared_ptr<rcg::CPort> *)0x14f3d3);
  this_00 = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 0xf8);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x14f3e9);
  std::shared_ptr<rcg::Device>::operator=
            ((shared_ptr<rcg::Device> *)this_00,(shared_ptr<rcg::Device> *)psVar1);
  std::shared_ptr<const_rcg::GenTLWrapper>::operator=(this_00,psVar1);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x80),in_RCX);
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  return;
}

Assistant:

Stream::Stream(const std::shared_ptr<Device> &_parent,
               const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id) :
               buffer(_gentl, this)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  stream=0;
  event=0;
  bn=0;
}